

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::DistributionFunc::~DistributionFunc(DistributionFunc *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x40);
  return;
}

Assistant:

DistributionFunc(KnownSystemName knownNameId, size_t numArgs) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), numArgs(numArgs) {
        hasOutputArgs = true;
    }